

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SpanTest_ConstExpr_Test::TestBody(SpanTest_ConstExpr_Test *this)

{
  return;
}

Assistant:

TEST(SpanTest, ConstExpr) {
  static constexpr int v[] = {1, 2, 3, 4};
  constexpr bssl::Span<const int> span1(v);
  static_assert(span1.size() == 4u, "wrong size");
  constexpr bssl::Span<const int> span2 = MakeConstSpan(v);
  static_assert(span2.size() == 4u, "wrong size");
  static_assert(span2.subspan(1).size() == 3u, "wrong size");
  static_assert(span2.first(1).size() == 1u, "wrong size");
  static_assert(span2.last(1).size() == 1u, "wrong size");
  static_assert(span2[0] == 1, "wrong value");
}